

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.h
# Opt level: O0

void __thiscall SInputFile::SInputFile(SInputFile *this,int param_1)

{
  allocator<char> local_15;
  int local_14;
  SInputFile *pSStack_10;
  int param_1_local;
  SInputFile *this_local;
  
  local_14 = param_1;
  pSStack_10 = this;
  std::filesystem::__cxx11::path::path(&this->full);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->str,"<stdin>",&local_15);
  std::allocator<char>::~allocator(&local_15);
  return;
}

Assistant:

SInputFile(int) : full(), str("<stdin>") {}